

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O3

void __thiscall
mp::SolverOptionManager::
ConcreteOption<mp::BasicSolver,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::GetValue(ConcreteOption<mp::BasicSolver,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  code *pcVar1;
  long *plVar2;
  long *local_30 [2];
  long local_20 [2];
  
  pcVar1 = (code *)this->get_;
  plVar2 = (long *)((long)&(this->handler_->super_ErrorHandler)._vptr_ErrorHandler +
                   *(long *)&this->field_0xe0);
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *plVar2 + -1);
  }
  (*pcVar1)((string *)local_30,plVar2,this);
  std::__cxx11::string::operator=((string *)value,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void GetValue(T &value) const { value = (handler_.*get_)(*this); }